

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__gif_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  stbi_uc *in_RDI;
  int in_R8D;
  stbi__gif g;
  stbi_uc *u;
  undefined4 local_88a8;
  undefined4 local_88a4;
  void *local_88a0;
  void *local_8898;
  void *local_8890;
  uint in_stack_ffffffffffff7778;
  uint in_stack_ffffffffffff777c;
  int in_stack_ffffffffffff7780;
  int in_stack_ffffffffffff7784;
  uchar *in_stack_ffffffffffff7788;
  stbi_uc *in_stack_ffffffffffff77a8;
  int in_stack_ffffffffffff77b4;
  int *in_stack_ffffffffffff77b8;
  stbi__gif *in_stack_ffffffffffff77c0;
  stbi__context *in_stack_ffffffffffff77c8;
  stbi_uc *local_38;
  
  memset(&local_88a8,0,0x8870);
  local_38 = stbi__gif_load_next(in_stack_ffffffffffff77c8,in_stack_ffffffffffff77c0,
                                 in_stack_ffffffffffff77b8,in_stack_ffffffffffff77b4,
                                 in_stack_ffffffffffff77a8);
  if (local_38 == in_RDI) {
    local_38 = (stbi_uc *)0x0;
  }
  if (local_38 == (stbi_uc *)0x0) {
    if (local_88a0 != (void *)0x0) {
      free(local_88a0);
    }
  }
  else {
    *in_RSI = local_88a8;
    *in_RDX = local_88a4;
    if ((in_R8D != 0) && (in_R8D != 4)) {
      local_38 = stbi__convert_format
                           (in_stack_ffffffffffff7788,in_stack_ffffffffffff7784,
                            in_stack_ffffffffffff7780,in_stack_ffffffffffff777c,
                            in_stack_ffffffffffff7778);
    }
  }
  free(local_8890);
  free(local_8898);
  return local_38;
}

Assistant:

static void *stbi__gif_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   stbi_uc *u = 0;
   stbi__gif g;
   memset(&g, 0, sizeof(g));
   STBI_NOTUSED(ri);

   u = stbi__gif_load_next(s, &g, comp, req_comp, 0);
   if (u == (stbi_uc *) s) u = 0;  // end of animated gif marker
   if (u) {
      *x = g.w;
      *y = g.h;

      // moved conversion to after successful load so that the same
      // can be done for multiple frames.
      if (req_comp && req_comp != 4)
         u = stbi__convert_format(u, 4, req_comp, g.w, g.h);
   } else if (g.out) {
      // if there was an error and we allocated an image buffer, free it!
      STBI_FREE(g.out);
   }

   // free buffers needed for multiple frame loading;
   STBI_FREE(g.history);
   STBI_FREE(g.background);

   return u;
}